

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.c
# Opt level: O2

void * coll_deque_insert_at(coll_deque_t *deque,void *data,size_t index)

{
  ulong uVar1;
  ulong uVar2;
  void **ppvVar3;
  
  uVar1 = deque->len;
  if (uVar1 < index) {
    data = (void *)0x0;
  }
  else if (uVar1 == index) {
    coll_deque_append(deque,data);
  }
  else {
    uVar2 = deque->cap;
    if (uVar1 == uVar2) {
      coll_deque_resize(deque);
      uVar1 = deque->len;
      uVar2 = deque->cap;
    }
    uVar2 = (deque->head + index) % uVar2;
    if (index < uVar1 >> 1) {
      coll_deque_reserve(deque,uVar2,true);
      ppvVar3 = deque->data + (uVar2 - 1);
    }
    else {
      coll_deque_reserve(deque,uVar2,false);
      ppvVar3 = deque->data + uVar2;
    }
    *ppvVar3 = data;
    deque->len = deque->len + 1;
  }
  return data;
}

Assistant:

void *coll_deque_insert_at(coll_deque_t *deque, void *data, size_t index) {
    if (index > deque->len) {
        return NULL;
    } else if (index == deque->len) {
        return coll_deque_append(deque, data);
    }
    if (deque->len == deque->cap) {
        coll_deque_resize(deque);
    }

    size_t pos = index_to_pos(deque, index);

    if (index < deque->len / 2) {
        coll_deque_reserve(deque, pos, true);
        deque->data[--pos] = data;
    } else {
        coll_deque_reserve(deque, pos, false);
        deque->data[pos] = data;
    }
    ++(deque->len);
    return data;
}